

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O1

uint64_t __thiscall node::BlockManager::CalculateCurrentUsage(BlockManager *this)

{
  CBlockFileInfo *file;
  pointer pCVar1;
  uint64_t uVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  unique_lock<std::recursive_mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._M_owns = false;
  local_20._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&local_20);
  uVar2 = 0;
  for (pCVar1 = (this->m_blockfile_info).
                super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar1 != (this->m_blockfile_info).
                super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
                super__Vector_impl_data._M_finish; pCVar1 = pCVar1 + 1) {
    uVar2 = uVar2 + (pCVar1->nUndoSize + pCVar1->nSize);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t BlockManager::CalculateCurrentUsage()
{
    LOCK(cs_LastBlockFile);

    uint64_t retval = 0;
    for (const CBlockFileInfo& file : m_blockfile_info) {
        retval += file.nSize + file.nUndoSize;
    }
    return retval;
}